

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1_fib.cpp
# Opt level: O1

int main(void)

{
  size_t sVar1;
  pointer pBVar2;
  long *plVar3;
  int iVar4;
  undefined2 *puVar5;
  size_t sVar6;
  undefined1 *puVar7;
  void *__dest;
  size_type *psVar8;
  long lVar9;
  value_type *__val;
  ulong uVar10;
  size_t sVar11;
  ByteCode bc;
  Generator gen;
  ofstream file;
  ByteCode local_5f0;
  ulong local_5d8;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  value_type local_530;
  Generator local_510;
  vector<ag::Type,_std::allocator<ag::Type>_> local_3d8;
  vector<ag::Type,_std::allocator<ag::Type>_> local_3b8;
  long *local_398;
  size_t local_390;
  long local_388 [2];
  long *local_378;
  size_t local_370;
  long local_368 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  byte local_300;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  byte local_2d8;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  byte local_2b0;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  byte local_288;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  byte local_260;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  byte local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_510.Function.m_gen = &local_510;
  memset(&local_510.Function.m_cur,0,0x99);
  local_510.m_ver_minor = 1;
  memset(&local_510.m_strtbl,0,0x90);
  local_510.m_ver_major = '\x01';
  local_510.m_ver_minor = 0;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"a","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_510.m_globals,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"main","");
  local_3b8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3b8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ag::Generator::FunctionManager::Create(&local_510.Function,&local_550,'\0',&local_3b8,&local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  if (local_3b8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"fib","");
  local_3d8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3d8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ag::Generator::FunctionManager::Create
            (&local_510.Function,&local_570,'\x01',&local_3d8,&local_358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  if (local_3d8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  local_5d8 = (long)local_510.m_globals.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_510.m_globals.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"fib","");
  plVar3 = local_378;
  sVar6 = local_510.Function.m_cur;
  if ((long)local_510.Function.m_funcs.
            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_510.Function.m_funcs.
            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar9 = ((long)local_510.Function.m_funcs.
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_510.Function.m_funcs.
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    psVar8 = &((local_510.Function.m_funcs.
                super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                super__Vector_impl_data._M_start)->Name)._M_string_length;
    sVar11 = 0;
    do {
      sVar1 = *psVar8;
      if ((sVar1 == local_370) &&
         ((sVar6 = sVar11, sVar1 == 0 ||
          (iVar4 = bcmp((((string *)(psVar8 + -1))->_M_dataplus)._M_p,plVar3,sVar1), iVar4 == 0))))
      break;
      sVar11 = sVar11 + 1;
      psVar8 = psVar8 + 9;
      sVar6 = local_510.Function.m_cur;
    } while (lVar9 + (ulong)(lVar9 == 0) != sVar11);
  }
  local_510.Function.m_cur = sVar6;
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  local_258._M_rest._0_4_ = (undefined4)0;
  local_238 = 2;
  ag::Generator::FunctionManager::PushStack(&local_510.Function,(agvariant *)&local_258._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_238]._M_data)
            ((anon_class_1_0_00000001 *)&local_230,
             (variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_258._M_first);
  local_238 = 0xff;
  local_230._0_1_ = (anon_class_1_0_00000001)0x39;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  pBVar2 = local_510.Function.m_code.super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = local_510.Function.m_cur;
  puVar5 = (undefined2 *)operator_new(2);
  *puVar5 = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6),
             *(undefined8 *)
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6) + 8),puVar5,
             puVar5 + 1);
  operator_delete(puVar5,2);
  local_230._0_1_ = (anon_class_1_0_00000001)0x16;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  sVar6 = ag::Generator::FunctionManager::If(&local_510.Function);
  local_280._M_rest._0_4_ = (undefined4)0;
  local_260 = 2;
  ag::Generator::FunctionManager::PushStack(&local_510.Function,(agvariant *)&local_280._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_260]._M_data)
            ((anon_class_1_0_00000001 *)&local_230,
             (variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_280._M_first);
  local_260 = 0xff;
  local_230._0_1_ = (anon_class_1_0_00000001)0x2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  local_510.Function.m_linkAddr.
  super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[local_510.Function.m_cur].
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start[sVar6].second =
       (long)local_510.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_510.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_2a8._M_rest._0_4_ = (undefined4)1;
  local_288 = 2;
  ag::Generator::FunctionManager::PushStack(&local_510.Function,(agvariant *)&local_2a8._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_288]._M_data)
            ((anon_class_1_0_00000001 *)&local_230,
             (variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2a8._M_first);
  local_288 = 0xff;
  local_230._0_1_ = (anon_class_1_0_00000001)0x39;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  pBVar2 = local_510.Function.m_code.super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = local_510.Function.m_cur;
  puVar5 = (undefined2 *)operator_new(2);
  *puVar5 = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6),
             *(undefined8 *)
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6) + 8),puVar5,
             puVar5 + 1);
  operator_delete(puVar5,2);
  local_230._0_1_ = (anon_class_1_0_00000001)0x16;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  sVar6 = ag::Generator::FunctionManager::If(&local_510.Function);
  local_2d0._M_rest._0_4_ = (undefined4)1;
  local_2b0 = 2;
  ag::Generator::FunctionManager::PushStack(&local_510.Function,(agvariant *)&local_2d0._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_2b0]._M_data)
            ((anon_class_1_0_00000001 *)&local_230,
             (variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2d0._M_first);
  local_2b0 = 0xff;
  local_230._0_1_ = (anon_class_1_0_00000001)0x2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  local_510.Function.m_linkAddr.
  super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[local_510.Function.m_cur].
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start[sVar6].second =
       (long)local_510.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_510.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_230._0_1_ = (anon_class_1_0_00000001)0x39;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  pBVar2 = local_510.Function.m_code.super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = local_510.Function.m_cur;
  puVar5 = (undefined2 *)operator_new(2);
  *puVar5 = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6),
             *(undefined8 *)
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6) + 8),puVar5,
             puVar5 + 1);
  operator_delete(puVar5,2);
  local_2f8._M_rest._0_4_ = (undefined4)1;
  local_2d8 = 2;
  ag::Generator::FunctionManager::PushStack(&local_510.Function,(agvariant *)&local_2f8._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_2d8]._M_data)
            ((anon_class_1_0_00000001 *)&local_230,
             (variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2f8._M_first);
  local_2d8 = 0xff;
  local_230 = CONCAT71(local_230._1_7_,7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"fib","");
  ag::Generator::FunctionManager::CallReturn(&local_510.Function,&local_590,'\x01');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  local_230._0_1_ = (anon_class_1_0_00000001)0x39;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  pBVar2 = local_510.Function.m_code.super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = local_510.Function.m_cur;
  puVar5 = (undefined2 *)operator_new(2);
  *puVar5 = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6),
             *(undefined8 *)
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6) + 8),puVar5,
             puVar5 + 1);
  operator_delete(puVar5,2);
  local_320._M_rest._0_4_ = (undefined4)2;
  local_300 = 2;
  ag::Generator::FunctionManager::PushStack(&local_510.Function,(agvariant *)&local_320._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_300]._M_data)
            ((anon_class_1_0_00000001 *)&local_230,
             (variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_320._M_first);
  local_300 = 0xff;
  local_230 = CONCAT71(local_230._1_7_,7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"fib","");
  ag::Generator::FunctionManager::CallReturn(&local_510.Function,&local_5b0,'\x01');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  local_230._0_1_ = (anon_class_1_0_00000001)0x6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  local_230 = CONCAT71(local_230._1_7_,2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"main","");
  plVar3 = local_398;
  sVar6 = local_510.Function.m_cur;
  if ((long)local_510.Function.m_funcs.
            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_510.Function.m_funcs.
            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar9 = ((long)local_510.Function.m_funcs.
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_510.Function.m_funcs.
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    psVar8 = &((local_510.Function.m_funcs.
                super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                super__Vector_impl_data._M_start)->Name)._M_string_length;
    sVar11 = 0;
    do {
      sVar1 = *psVar8;
      if ((sVar1 == local_390) &&
         ((sVar6 = sVar11, sVar1 == 0 ||
          (iVar4 = bcmp((((string *)(psVar8 + -1))->_M_dataplus)._M_p,plVar3,sVar1), iVar4 == 0))))
      break;
      sVar11 = sVar11 + 1;
      psVar8 = psVar8 + 9;
      sVar6 = local_510.Function.m_cur;
    } while (lVar9 + (ulong)(lVar9 == 0) != sVar11);
  }
  local_510.Function.m_cur = sVar6;
  if (local_398 != local_388) {
    operator_delete(local_398,local_388[0] + 1);
  }
  local_230 = CONCAT71(local_230._1_7_,0x23);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  pBVar2 = local_510.Function.m_code.super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = local_510.Function.m_cur;
  puVar7 = (undefined1 *)operator_new(2);
  iVar4 = (int)(local_5d8 >> 5) + -1;
  *puVar7 = (char)iVar4;
  puVar7[1] = (char)((uint)iVar4 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6),
             *(undefined8 *)
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar2 + sVar6) + 8),puVar7,
             puVar7 + 2);
  operator_delete(puVar7,2);
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"fib","");
  ag::Generator::FunctionManager::CallReturn(&local_510.Function,&local_5d0,'\x01');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  local_230 = CONCAT71(local_230._1_7_,2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_510.Function.m_code.
              super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
              super__Vector_impl_data._M_start[local_510.Function.m_cur].m_bytes,(uchar *)&local_230
            );
  ag::Generator::Get(&local_5f0,&local_510);
  std::ofstream::ofstream(&local_230,"fib.bv",_S_out|_S_bin);
  uVar10 = (long)local_5f0.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_5f0.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (uVar10 == 0) {
    __dest = (void *)0x0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = operator_new(uVar10);
  }
  if ((long)local_5f0.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_5f0.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    memmove(__dest,local_5f0.m_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
            (long)local_5f0.m_bytes.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_5f0.m_bytes.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  std::ostream::write((char *)&local_230,(long)__dest);
  if (__dest != (void *)0x0) {
    operator_delete(__dest,uVar10);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_5f0.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f0.m_bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5f0.m_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f0.m_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ag::Generator::~Generator(&local_510);
  return 0;
}

Assistant:

int main() {
	ag::Generator gen;

	// header - version
	gen.SetHeader(1, 0);

	size_t nid = gen.AddGlobal("a");

	gen.Function.Create("main");	// define main()
	gen.Function.Create("fib", 1);	// define fib(a)

	gen.Function.SetCurrent("fib");
		gen.Function.PushStack(0);			// 0
		gen.Function.GetArgumentPointer(0);	// arg0 0
		gen.Function.Equal();				// arg0 == 0
		size_t if1 = gen.Function.If();		// if (arg0 == 0)
			gen.Function.PushStack(0);		// 0
			gen.Function.Return();			// return 0;
		gen.Function.SetAddress(if1, gen.Function.GetCurrentAddress());

		gen.Function.PushStack(1);			// 1
		gen.Function.GetArgumentPointer(0);	// arg0 1
		gen.Function.Equal();				// arg0 == 1
		size_t if2 = gen.Function.If();		// if (arg0 == 1)
			gen.Function.PushStack(1);		// 1
			gen.Function.Return();			// return 1;
		gen.Function.SetAddress(if2, gen.Function.GetCurrentAddress());

		gen.Function.GetArgumentPointer(0);	// &arg0
		gen.Function.PushStack(1);			// 1 arg0
		gen.Function.Subtract();			// arg0 - 1
		gen.Function.CallReturn("fib", 1);	// fib(arg0 - 1)

		gen.Function.GetArgumentPointer(0);	// &arg0 fib(arg0 - 1)
		gen.Function.PushStack(2);			// 2 arg0 fib(arg0 - 1)
		gen.Function.Subtract();			// arg0-2 fib(arg0 - 1)
		gen.Function.CallReturn("fib", 1);	// fib(arg0 - 2) fib(arg0 - 1)

		gen.Function.Add();					// fib(arg0 - 1) + fib(arg0 - 2)

		gen.Function.Return();				// return fib(arg0 - 1) + fiv(arg0 - 2);

	gen.Function.SetCurrent("main");
		gen.Function.GetGlobal(nid);		// a
		gen.Function.CallReturn("fib", 1);	// fib(a)
		gen.Function.Return();				// return fib(a)

	ag::ByteCode bc = gen.Get();	// get bytecode

	std::ofstream file("fib.bv", std::ios::out | std::ios::binary);
	file.write(reinterpret_cast<const char *>(bc.Get().data()), bc.Count());

	return 0;
}